

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::PythonGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  char *__s;
  string local_40;
  
  BVar1 = (field->value).type.base_type;
  if (BVar1 == BASE_TYPE_ARRAY || BVar1 - BASE_TYPE_UTYPE < 0xc) {
    GenTypeBasic_abi_cxx11_(&local_40,this,&(field->value).type);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (__return_storage_ptr__,&this->namer_,&local_40,
               (ulong)(this->namer_).super_Namer.config_.methods);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    if (BVar1 == BASE_TYPE_STRUCT) {
      __s = "UOffsetTRelative";
      if (((field->value).type.struct_def)->fixed != false) {
        __s = "Struct";
      }
    }
    else {
      __s = "UOffsetTRelative";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMethod(const FieldDef &field) const {
    return (IsScalar(field.value.type.base_type) || IsArray(field.value.type))
               ? namer_.Method(GenTypeBasic(field.value.type))
               : (IsStruct(field.value.type) ? "Struct" : "UOffsetTRelative");
  }